

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

int IsPipeliningPossible(Curl_easy *handle,connectdata *conn)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (((conn->handler->protocol & 3) != 0) &&
     (((conn->bits).protoconnstart != true || ((conn->bits).close == false)))) {
    _Var1 = Curl_pipeline_wanted(handle->multi,1);
    uVar2 = 0;
    if ((_Var1) && ((handle->set).httpversion != 1)) {
      uVar2 = (uint)(((handle->set).httpreq - HTTPREQ_GET & 0xfffffffb) == 0);
    }
    _Var1 = Curl_pipeline_wanted(handle->multi,2);
    uVar3 = uVar2;
    if ((_Var1) && (uVar3 = uVar2 + 2, (handle->set).httpversion < 3)) {
      uVar3 = uVar2;
    }
  }
  return uVar3;
}

Assistant:

static int IsPipeliningPossible(const struct Curl_easy *handle,
                                const struct connectdata *conn)
{
  int avail = 0;

  /* If a HTTP protocol and pipelining is enabled */
  if((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
     (!conn->bits.protoconnstart || !conn->bits.close)) {

    if(Curl_pipeline_wanted(handle->multi, CURLPIPE_HTTP1) &&
       (handle->set.httpversion != CURL_HTTP_VERSION_1_0) &&
       (handle->set.httpreq == HTTPREQ_GET ||
        handle->set.httpreq == HTTPREQ_HEAD))
      /* didn't ask for HTTP/1.0 and a GET or HEAD */
      avail |= CURLPIPE_HTTP1;

    if(Curl_pipeline_wanted(handle->multi, CURLPIPE_MULTIPLEX) &&
       (handle->set.httpversion >= CURL_HTTP_VERSION_2))
      /* allows HTTP/2 */
      avail |= CURLPIPE_MULTIPLEX;
  }
  return avail;
}